

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blk_sse_sum_sse2.c
# Opt level: O0

void aom_get_blk_sse_sum_sse2(int16_t *data,int stride,int bw,int bh,int *x_sum,int64_t *x2_sum)

{
  uint in_ECX;
  int in_EDX;
  int in_ESI;
  int16_t *in_RDI;
  int *in_R8;
  int64_t *in_R9;
  int16_t *unaff_retaddr;
  int i;
  undefined4 local_2c;
  int loop_cycles;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 uVar1;
  int bh_00;
  int stride_00;
  
  *in_R8 = 0;
  *in_R9 = 0;
  if ((in_ECX & 3) == 0) {
    bh_00 = (int)in_RDI;
    stride_00 = (int)((ulong)in_RDI >> 0x20);
    if (in_EDX == 4) {
      sse_sum_wd4_sse2(unaff_retaddr,stride_00,bh_00,(int *)CONCAT44(in_ESI,4),
                       (int64_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8));
    }
    else {
      loop_cycles = (int)((ulong)in_R8 >> 0x20);
      if ((in_EDX == 8) || (in_EDX == 0x10)) {
        sse_sum_wd8_sse2(unaff_retaddr,stride_00,bh_00,(int *)CONCAT44(in_ESI,in_EDX),
                         (int64_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8),loop_cycles);
      }
      else if (in_EDX == 0x20) {
        if ((int)in_ECX < 0x21) {
          sse_sum_wd8_sse2(unaff_retaddr,stride_00,bh_00,(int *)CONCAT44(in_ESI,0x20),
                           (int64_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8),loop_cycles);
        }
        else {
          sse_sum_wd8_sse2(unaff_retaddr,stride_00,bh_00,(int *)CONCAT44(in_ESI,0x20),
                           (int64_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8),loop_cycles);
          sse_sum_wd8_sse2(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                           (int *)CONCAT44(in_ESI,in_EDX),
                           (int64_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8),
                           (int)((ulong)in_R8 >> 0x20));
        }
      }
      else if (in_EDX == 0x40) {
        if ((int)in_ECX < 0x11) {
          sse_sum_wd8_sse2(unaff_retaddr,stride_00,bh_00,(int *)CONCAT44(in_ESI,0x40),
                           (int64_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8),loop_cycles);
        }
        else {
          uVar1 = 0x40;
          for (local_2c = 0; local_2c < (int)in_ECX; local_2c = local_2c + 0x10) {
            sse_sum_wd8_sse2(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                             (int *)CONCAT44(in_ESI,uVar1),
                             (int64_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8),
                             (int)((ulong)in_R8 >> 0x20));
          }
        }
      }
      else {
        aom_get_blk_sse_sum_c(in_RDI,in_ESI,in_EDX,in_ECX,in_R8,in_R9);
      }
    }
  }
  else {
    aom_get_blk_sse_sum_c(in_RDI,in_ESI,in_EDX,in_ECX,in_R8,in_R9);
  }
  return;
}

Assistant:

void aom_get_blk_sse_sum_sse2(const int16_t *data, int stride, int bw, int bh,
                              int *x_sum, int64_t *x2_sum) {
  *x_sum = 0;
  *x2_sum = 0;

  if ((bh & 3) == 0) {
    switch (bw) {
      case 4: sse_sum_wd4_sse2(data, stride, bh, x_sum, x2_sum); break;
      case 8:
      case 16:
        sse_sum_wd8_sse2(data, stride, bh, x_sum, x2_sum, bw >> 3);
        break;
        // For widths 32 and 64, the registers may overflow. So compute
        // partial widths at a time.
      case 32:
        if (bh <= 32) {
          sse_sum_wd8_sse2(data, stride, bh, x_sum, x2_sum, bw >> 3);
          break;
        } else {
          sse_sum_wd8_sse2(data, stride, 32, x_sum, x2_sum, bw >> 3);
          sse_sum_wd8_sse2(data + 32 * stride, stride, 32, x_sum, x2_sum,
                           bw >> 3);
          break;
        }

      case 64:
        if (bh <= 16) {
          sse_sum_wd8_sse2(data, stride, bh, x_sum, x2_sum, bw >> 3);
          break;
        } else {
          for (int i = 0; i < bh; i += 16)
            sse_sum_wd8_sse2(data + i * stride, stride, 16, x_sum, x2_sum,
                             bw >> 3);
          break;
        }

      default: aom_get_blk_sse_sum_c(data, stride, bw, bh, x_sum, x2_sum);
    }
  } else {
    aom_get_blk_sse_sum_c(data, stride, bw, bh, x_sum, x2_sum);
  }
}